

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintElem.hpp
# Opt level: O2

void __thiscall OpenMD::ConstraintElem::~ConstraintElem(ConstraintElem *this)

{
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->moving_).
              super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->moved_).
              super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

ConstraintElem(StuntDouble* sd) : sd_(sd) {
      std::shared_ptr<GenericData> movedData = sd_->getPropertyByName("Moved");
      if (movedData != nullptr) {  // if generic data with keyword "moved"
                                   // exists, assign it to moved_
        moved_ = std::dynamic_pointer_cast<BoolGenericData>(movedData);
        if (moved_ == nullptr) {
          snprintf(
              painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
              "Generic Data with keyword Moved exists, however, it can not "
              "be casted to a BoolGenericData.\n");
          painCave.isFatal = 1;
          ;
          simError();
        }
      } else {  // if generic data with keyword "moved" does not exist, create
                // it
        moved_ = std::make_shared<BoolGenericData>("Moved");
        sd_->addProperty(moved_);
      }

      std::shared_ptr<GenericData> movingData =
          sd_->getPropertyByName("Moving");
      if (movingData != nullptr) {
        moving_ = std::dynamic_pointer_cast<BoolGenericData>(movingData);
        if (moving_ == nullptr) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Generic Data with keyword Moving exists, however, it can "
                   "not be casted to a BoolGenericData.\n");
          painCave.isFatal = 1;
          ;
          simError();
        }
      } else {
        moving_ = std::make_shared<BoolGenericData>("Moving");
        sd_->addProperty(moving_);
      }
    }